

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O0

void __thiscall
CRegexStack::pop(CRegexStack *this,int *start_ofs,int *str_ofs,size_t *curlen,re_state_id *state,
                re_state_id *final,re_group_register *regs,short *loop_vars,int *iter)

{
  int iVar1;
  char *pcVar2;
  long *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  CRegexStack *in_RDI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  regex_stack_var *var;
  regex_stack_entry *fp;
  int *local_40;
  
  pcVar2 = in_RDI->buf_;
  iVar1 = in_RDI->sp_;
  *in_RSI = *(undefined4 *)(pcVar2 + (long)iVar1 + 4);
  *in_RDX = *(undefined4 *)(pcVar2 + (long)iVar1 + 8);
  *in_RCX = (long)*(int *)(pcVar2 + (long)iVar1 + 0xc);
  *in_R8 = *(undefined4 *)(pcVar2 + (long)iVar1 + 0x10);
  *in_R9 = *(undefined4 *)(pcVar2 + (long)iVar1 + 0x14);
  *final = *(re_state_id *)(pcVar2 + (long)iVar1 + 0x1c);
  for (local_40 = (int *)(pcVar2 + (long)iVar1 + 0x24); local_40 < in_RDI->buf_ + in_RDI->used_;
      local_40 = local_40 + 3) {
    if (*local_40 < 10) {
      *(undefined8 *)(&var->id + (long)*local_40 * 2) = *(undefined8 *)(local_40 + 1);
    }
    else {
      *(short *)((long)&fp->typ + (long)(*local_40 + -10) * 2) = (short)local_40[1];
    }
  }
  discard(in_RDI);
  return;
}

Assistant:

void pop(int *start_ofs, int *str_ofs, size_t *curlen,
             re_state_id *state, re_state_id *final,
             re_group_register *regs, short *loop_vars, int *iter)
    {
        /* get the stack pointer */
        regex_stack_entry *fp = (regex_stack_entry *)(buf_ + sp_);

        /* restore the string offset and state ID */
        *start_ofs = fp->start_ofs;
        *str_ofs = fp->str_ofs;
        *curlen = fp->curlen;
        *state = fp->state;
        *final = fp->final;
        *iter = fp->iter;
        
        /* run through the saved registers/variables in the state */
        for (regex_stack_var *var = (regex_stack_var *)(fp + 1) ;
             var < (regex_stack_var *)(buf_ + used_) ; ++var)
        {
            /* sense the type */
            if (var->id < RE_GROUP_REG_CNT)
            {
                /* it's a group register */
                regs[var->id] = var->val.group;
            }
            else
            {
                /* it's a loop variable */
                loop_vars[var->id - RE_GROUP_REG_CNT] = var->val.loopvar;
            }
        }

        /* we're done with the stop stack frame, so discard it */
        discard();
    }